

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

string * ot::commissioner::Console::Read_abi_cxx11_(void)

{
  string *in_RDI;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = "";
  while ((pcVar1 == (char *)0x0 || (*pcVar1 == '\0'))) {
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   mPrompt_abi_cxx11_,"> ");
    pcVar1 = (char *)readline(local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
  }
  add_history(pcVar1);
  std::__cxx11::string::string((string *)in_RDI,pcVar1,(allocator *)&local_48);
  return in_RDI;
}

Assistant:

std::string Console::Read()
{
    const char *line = "";

    while (line == nullptr || strlen(line) == 0)
    {
        line = readline((mPrompt + "> ").c_str());
    }

    add_history(line);

    return line;
}